

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token __thiscall slang::parsing::Lexer::lexEscapeSequence(Lexer *this,bool isMacroName)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  TokenKind kind;
  Token TVar4;
  SyntaxKind local_4;
  
  pbVar2 = (byte *)this->sourceBuffer;
  bVar1 = *pbVar2;
  uVar3 = (ulong)bVar1;
  if (uVar3 < 0x21) {
    if ((0x100001a01U >> (uVar3 & 0x3f) & 1) != 0) {
      kind = Unknown;
      goto LAB_002b521e;
    }
    if ((0x2400UL >> (uVar3 & 0x3f) & 1) != 0) {
      this->sourceBuffer = (char *)(pbVar2 + 1);
      if ((bVar1 == 0xd) && (pbVar2[1] == 10)) {
        this->sourceBuffer = (char *)(pbVar2 + 2);
      }
      kind = LineContinuation;
      goto LAB_002b521e;
    }
  }
  pbVar2 = pbVar2 + 1;
  do {
    if (0x5e < (byte)((char)uVar3 - 0x20U)) break;
    this->sourceBuffer = (char *)pbVar2;
    uVar3 = (ulong)*pbVar2;
    pbVar2 = pbVar2 + 1;
  } while ((0x20 < uVar3) || ((0x100003e00U >> (uVar3 & 0x3f) & 1) == 0));
  if (isMacroName) {
    TVar4 = create<slang::syntax::SyntaxKind>(this,Directive,&local_4);
    return TVar4;
  }
  kind = Identifier;
LAB_002b521e:
  TVar4 = create<>(this,kind);
  return TVar4;
}

Assistant:

Token Lexer::lexEscapeSequence(bool isMacroName) {
    char c = peek();
    if (isWhitespace(c) || c == '\0') {
        // Check for a line continuation sequence.
        if (isNewline(c)) {
            advance();
            if (c == '\r' && peek() == '\n')
                advance();
            return create(TokenKind::LineContinuation);
        }

        // Error issued in the Preprocessor
        return create(TokenKind::Unknown);
    }

    while (isPrintableASCII(c)) {
        advance();
        c = peek();
        if (isWhitespace(c))
            break;
    }

    if (isMacroName)
        return create(TokenKind::Directive, SyntaxKind::MacroUsage);

    return create(TokenKind::Identifier);
}